

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_cwd(connectdata *conn)

{
  CURLcode CVar1;
  ftp_conn *ftpc;
  CURLcode result;
  connectdata *conn_local;
  
  if (((conn->proto).ftpc.cwddone & 1U) == 0) {
    (conn->proto).ftpc.count2 = 0;
    *(uint *)((long)&conn->proto + 0xac) = (uint)((conn->data->set).ftp_create_missing_dirs == 2);
    if ((((conn->bits).reuse & 1U) == 0) || ((conn->proto).ftpc.entrypath == (char *)0x0)) {
      if ((conn->proto).ftpc.dirdepth == 0) {
        ftpc._4_4_ = ftp_state_mdtm(conn);
      }
      else {
        (conn->proto).ftpc.count1 = 1;
        CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"CWD %s",
                              (conn->proto).ftpc.dirs[(conn->proto).ftpc.count1 + -1]);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        _state(conn,FTP_CWD);
        ftpc._4_4_ = CURLE_OK;
      }
    }
    else {
      (conn->proto).ftpc.count1 = 0;
      CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"CWD %s",(conn->proto).ftpc.entrypath);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      _state(conn,FTP_CWD);
      ftpc._4_4_ = CURLE_OK;
    }
  }
  else {
    ftpc._4_4_ = ftp_state_mdtm(conn);
  }
  return ftpc._4_4_;
}

Assistant:

static CURLcode ftp_state_cwd(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(ftpc->cwddone)
    /* already done and fine */
    result = ftp_state_mdtm(conn);
  else {
    ftpc->count2 = 0; /* count2 counts failed CWDs */

    /* count3 is set to allow a MKD to fail once. In the case when first CWD
       fails and then MKD fails (due to another session raced it to create the
       dir) this then allows for a second try to CWD to it */
    ftpc->count3 = (conn->data->set.ftp_create_missing_dirs==2)?1:0;

    if(conn->bits.reuse && ftpc->entrypath) {
      /* This is a re-used connection. Since we change directory to where the
         transfer is taking place, we must first get back to the original dir
         where we ended up after login: */
      ftpc->count1 = 0; /* we count this as the first path, then we add one
                          for all upcoming ones in the ftp->dirs[] array */
      PPSENDF(&conn->proto.ftpc.pp, "CWD %s", ftpc->entrypath);
      state(conn, FTP_CWD);
    }
    else {
      if(ftpc->dirdepth) {
        ftpc->count1 = 1;
        /* issue the first CWD, the rest is sent when the CWD responses are
           received... */
        PPSENDF(&conn->proto.ftpc.pp, "CWD %s", ftpc->dirs[ftpc->count1 -1]);
        state(conn, FTP_CWD);
      }
      else {
        /* No CWD necessary */
        result = ftp_state_mdtm(conn);
      }
    }
  }
  return result;
}